

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ParsePurpose(AsciiParser *this,Purpose *result)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  size_type *psVar5;
  string str;
  ostringstream ss_e;
  string local_1f0;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  if ((result == (Purpose *)0x0) || (bVar1 = SkipCommentAndWhitespaceAndNewline(this,true), !bVar1))
  {
    return false;
  }
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  bVar1 = ReadIdentifier(this,&local_1d0);
  if (bVar1) {
    iVar2 = ::std::__cxx11::string::compare((char *)&local_1d0);
    if (iVar2 == 0) {
      *result = Default;
    }
    else {
      iVar2 = ::std::__cxx11::string::compare((char *)&local_1d0);
      if (iVar2 == 0) {
        *result = Render;
      }
      else {
        iVar2 = ::std::__cxx11::string::compare((char *)&local_1d0);
        if (iVar2 == 0) {
          *result = Proxy;
        }
        else {
          iVar2 = ::std::__cxx11::string::compare((char *)&local_1d0);
          if (iVar2 != 0) {
            ::std::__cxx11::ostringstream::ostringstream(local_190);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_190,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-basetype.cc"
                       ,0x5f);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[ASCII]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_190,"ParsePurpose",0xc);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"():",3);
            poVar3 = (ostream *)::std::ostream::operator<<(local_190,0x7ff);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
            ::std::operator+(&local_1b0,"Invalid purpose value: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1d0);
            plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1b0);
            psVar5 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar5) {
              local_1f0.field_2._M_allocated_capacity = *psVar5;
              local_1f0.field_2._8_8_ = plVar4[3];
              local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *psVar5;
              local_1f0._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_1f0._M_string_length = plVar4[1];
            *plVar4 = (long)psVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_190,local_1f0._M_dataplus._M_p,
                                local_1f0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::stringbuf::str();
            PushError(this,&local_1f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_190);
            ::std::ios_base::~ios_base(local_120);
            goto LAB_00371839;
          }
          *result = Guide;
        }
      }
    }
    bVar1 = true;
  }
  else {
LAB_00371839:
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) {
    return bVar1;
  }
  operator_delete(local_1d0._M_dataplus._M_p,
                  CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                           local_1d0.field_2._M_local_buf[0]) + 1);
  return bVar1;
}

Assistant:

bool AsciiParser::ParsePurpose(Purpose *result) {
  if (!result) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  std::string str;
  if (!ReadIdentifier(&str)) {
    return false;
  }

  if (str == "\"default\"") {
    (*result) = Purpose::Default;
  } else if (str == "\"render\"") {
    (*result) = Purpose::Render;
  } else if (str == "\"proxy\"") {
    (*result) = Purpose::Proxy;
  } else if (str == "\"guide\"") {
    (*result) = Purpose::Guide;
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kAscii, "Invalid purpose value: " + str + "\n");
  }

  return true;
}